

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O3

wchar_t attr_counter_inc(attr_counter **top,attr_counter *ac,attr_counter *last,
                        mtree_entry_conflict *me)

{
  wchar_t wVar1;
  attr_counter *paVar2;
  attr_counter **ppaVar3;
  attr_counter *paVar4;
  attr_counter *paVar5;
  wchar_t wVar6;
  
  if (ac == (attr_counter *)0x0) {
    wVar6 = L'\0';
    if (last != (attr_counter *)0x0) {
      paVar4 = (attr_counter *)malloc(0x20);
      if (paVar4 == (attr_counter *)0x0) {
        wVar6 = L'\xffffffff';
      }
      else {
        paVar4->prev = last;
        paVar4->next = (attr_counter *)0x0;
        paVar4->count = L'\x01';
        paVar4->m_entry = me;
        last->next = paVar4;
      }
    }
  }
  else {
    wVar1 = ac->count;
    ac->count = wVar1 + L'\x01';
    wVar6 = L'\0';
    if ((*top != ac) && (paVar4 = ac->prev, paVar5 = paVar4, wVar6 = L'\0', paVar4->count <= wVar1))
    {
      do {
        wVar6 = paVar5->count;
        if (wVar1 < wVar6) goto LAB_0017844b;
        ppaVar3 = &paVar5->prev;
        paVar5 = *ppaVar3;
      } while (*ppaVar3 != (attr_counter *)0x0);
      paVar5 = (attr_counter *)0x0;
LAB_0017844b:
      paVar2 = ac->next;
      paVar4->next = paVar2;
      if (paVar2 != (attr_counter *)0x0) {
        paVar2->prev = paVar4;
      }
      if (wVar1 < wVar6) {
        ac->prev = paVar5;
        ac->next = paVar5->next;
        paVar5->next = ac;
        wVar6 = L'\0';
        if (ac->next != (attr_counter *)0x0) {
          ac->next->prev = ac;
        }
      }
      else {
        ac->prev = (attr_counter *)0x0;
        ac->next = *top;
        *top = ac;
        ac->next->prev = ac;
        wVar6 = L'\0';
      }
    }
  }
  return wVar6;
}

Assistant:

static int
attr_counter_inc(struct attr_counter **top, struct attr_counter *ac,
    struct attr_counter *last, struct mtree_entry *me)
{
	struct attr_counter *pac;

	if (ac != NULL) {
		ac->count++;
		if (*top == ac || ac->prev->count >= ac->count)
			return (0);
		for (pac = ac->prev; pac; pac = pac->prev) {
			if (pac->count >= ac->count)
				break;
		}
		ac->prev->next = ac->next;
		if (ac->next != NULL)
			ac->next->prev = ac->prev;
		if (pac != NULL) {
			ac->prev = pac;
			ac->next = pac->next;
			pac->next = ac;
			if (ac->next != NULL)
				ac->next->prev = ac;
		} else {
			ac->prev = NULL;
			ac->next = *top;
			*top = ac;
			ac->next->prev = ac;
		}
	} else if (last != NULL) {
		ac = attr_counter_new(me, last);
		if (ac == NULL)
			return (-1);
		last->next = ac;
	}
	return (0);
}